

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void DumpFaceInfo(FaceInfo *f)

{
  Res RVar1;
  ostream *poVar2;
  byte bVar3;
  char *pcVar4;
  byte bVar5;
  
  RVar1 = f->res;
  poVar2 = std::operator<<((ostream *)&std::cout,"  res: ");
  bVar3 = RVar1.ulog2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(char)bVar3);
  poVar2 = std::operator<<(poVar2,' ');
  bVar5 = RVar1.vlog2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(char)bVar5);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1 << (bVar3 & 0x1f));
  poVar2 = std::operator<<(poVar2," x ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1 << (bVar5 & 0x1f));
  poVar2 = std::operator<<(poVar2,")");
  poVar2 = std::operator<<(poVar2,"  adjface: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[0]);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[1]);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[2]);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[3]);
  poVar2 = std::operator<<(poVar2,"  adjedge: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjedges & 3);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjedges >> 2 & 3);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjedges >> 4 & 3);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(f->adjedges >> 6));
  std::operator<<(poVar2,"  flags:");
  bVar3 = f->flags;
  if (bVar3 == 0) {
    pcVar4 = " (none)";
  }
  else {
    if ((bVar3 & 8) != 0) {
      std::operator<<((ostream *)&std::cout," subface");
      bVar3 = f->flags;
    }
    if ((bVar3 & 1) != 0) {
      std::operator<<((ostream *)&std::cout," constant");
      bVar3 = f->flags;
    }
    if ((bVar3 & 4) != 0) {
      std::operator<<((ostream *)&std::cout," nbconstant");
      bVar3 = f->flags;
    }
    if ((bVar3 & 2) == 0) goto LAB_0010d79d;
    pcVar4 = " hasedits";
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
LAB_0010d79d:
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void DumpFaceInfo(const Ptex::FaceInfo& f)
{
    Ptex::Res res = f.res;
    std::cout << "  res: " << int(res.ulog2) << ' ' << int(res.vlog2)
              << " (" << res.u() << " x " << res.v() << ")"
              << "  adjface: " 
              << f.adjfaces[0] << ' '
              << f.adjfaces[1] << ' '
              << f.adjfaces[2] << ' '
              << f.adjfaces[3]
              << "  adjedge: " 
              << f.adjedge(0) << ' '
              << f.adjedge(1) << ' '
              << f.adjedge(2) << ' '
              << f.adjedge(3)
              << "  flags:";
    // output flag names
    if (f.flags == 0) std::cout << " (none)";
    else {
        if (f.isSubface()) std::cout << " subface";
        if (f.isConstant()) std::cout << " constant";
        if (f.isNeighborhoodConstant()) std::cout << " nbconstant";
        if (f.hasEdits()) std::cout << " hasedits";
    }
    std::cout << std::endl;
}